

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O1

int sprng256_next(keccak_sponge *sponge,uint8_t *entropy,size_t entropylen)

{
  byte *pbVar1;
  uint64_t uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  
  iVar3 = -1;
  if (entropy != (uint8_t *)0x0 && sponge != (keccak_sponge *)0x0) {
    if ((long)entropylen < 0) {
      iVar3 = -2;
    }
    else {
      iVar3 = 2;
      if (sponge->flags == 0xbf0420879da9f2d9) {
        puVar6 = entropy;
        uVar4 = entropylen;
        if (entropylen != 0) {
          do {
            uVar2 = sponge->position;
            uVar5 = 0x88 - uVar2;
            uVar7 = uVar4 - uVar5;
            if (uVar4 < uVar5) {
              uVar5 = 0;
              do {
                pbVar1 = (byte *)((long)sponge->a + uVar5 + uVar2);
                *pbVar1 = *pbVar1 ^ puVar6[uVar5];
                uVar5 = uVar5 + 1;
              } while (uVar4 != uVar5);
              sponge->position = sponge->position + uVar4;
              uVar7 = 0;
            }
            else {
              if (uVar2 != 0x88) {
                uVar4 = 0;
                do {
                  pbVar1 = (byte *)((long)sponge->a + uVar4 + uVar2);
                  *pbVar1 = *pbVar1 ^ puVar6[uVar4];
                  uVar4 = uVar4 + 1;
                } while (uVar5 != uVar4);
              }
              keccakf(sponge);
              sponge->position = 0;
              puVar6 = puVar6 + uVar5;
            }
            uVar4 = uVar7;
          } while (uVar7 != 0);
        }
        memset(entropy,0,entropylen);
        iVar3 = sprng256_forget(sponge);
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int sprng256_next(keccak_sponge* const __restrict sponge,
                  uint8_t* const entropy,
                  const size_t entropylen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (entropy == NULL) {
    return SPONGERR_NULL;
  }
  if (entropylen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->flags != FLAG_SPONGEPRG) {
    return SPONGERR_NOTINIT;
  }

  _sponge_absorb(sponge, entropy, entropylen);  // Absorb the entropy,
  memset(entropy, 0, entropylen);               // zeroize the buffer,

  int err = sprng256_forget(sponge);  // And prevent baktracking.

  return err;
}